

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O2

REF_STATUS ref_phys_av_tag_attributes(REF_DICT ref_dict,REF_GEOM ref_geom)

{
  REF_STATUS RVar1;
  int iVar2;
  uint uVar3;
  int id;
  char *patch_type;
  
  id = 1;
  while( true ) {
    if (ref_geom->nface < id) {
      return 0;
    }
    RVar1 = ref_egads_get_attribute(ref_geom,2,id,"av:patch_type",&patch_type);
    if (((RVar1 == 0) && (iVar2 = strcmp("noslipwall",patch_type), iVar2 == 0)) &&
       (uVar3 = ref_dict_store(ref_dict,id,4000), uVar3 != 0)) break;
    id = id + 1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x1d6,
         "ref_phys_av_tag_attributes",(ulong)uVar3,"store");
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_phys_av_tag_attributes(REF_DICT ref_dict,
                                              REF_GEOM ref_geom) {
  const char *patch_type;
  REF_INT id, type;
  REF_STATUS ref_status;
  each_ref_geom_face_id(ref_geom, id) {
    ref_status = ref_egads_get_attribute(ref_geom, REF_GEOM_FACE, id,
                                         "av:patch_type", &patch_type);
    if (REF_SUCCESS == ref_status) {
      if (0 == strcmp("noslipwall", patch_type)) {
        type = 4000;
        RSS(ref_dict_store(ref_dict, id, type), "store");
      }
    }
  }
  return REF_SUCCESS;
}